

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O0

void __thiscall wasm::FindAll<wasm::GlobalGet>::FindAll::Finder::Finder(Finder *this)

{
  Finder *this_local;
  
  PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::PostWalker
            (&this->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>);
  return;
}

Assistant:

FindAll(Expression* ast) {
    struct Finder
      : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
      std::vector<T*>* list;
      void visitExpression(Expression* curr) {
        if (curr->is<T>()) {
          (*list).push_back(curr->cast<T>());
        }
      }
    };
    Finder finder;
    finder.list = &list;
    finder.walk(ast);
  }